

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseArray<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,VWReaderHandler<false> *handler)

{
  char *pcVar1;
  bool bVar2;
  long lVar3;
  SizeType count;
  
  is->src_ = is->src_ + 1;
  bVar2 = VWReaderHandler<false>::StartArray(handler);
  if (bVar2) {
    SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
    if (*(int *)(this + 0x30) != 0) {
      return;
    }
    if (*is->src_ == ']') {
      is->src_ = is->src_ + 1;
      count = 0;
    }
    else {
      count = 1;
      while( true ) {
        ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
                  (this,is,handler);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        pcVar1 = is->src_;
        if (*pcVar1 != ',') break;
        is->src_ = pcVar1 + 1;
        SkipWhitespace<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(is);
        count = count + 1;
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
      }
      if (*pcVar1 != ']') {
        lVar3 = (long)pcVar1 - (long)is->head_;
        *(undefined4 *)(this + 0x30) = 7;
        goto LAB_0019ddcc;
      }
      is->src_ = pcVar1 + 1;
    }
    bVar2 = VWReaderHandler<false>::EndArray(handler,count);
    if (bVar2) {
      return;
    }
  }
  lVar3 = (long)is->src_ - (long)is->head_;
  *(undefined4 *)(this + 0x30) = 0x10;
LAB_0019ddcc:
  *(long *)(this + 0x38) = lVar3;
  return;
}

Assistant:

void ParseArray(InputStream& is, Handler& handler)
  { RAPIDJSON_ASSERT(is.Peek() == '[');
    is.Take();  // Skip '['

    if (RAPIDJSON_UNLIKELY(!handler.StartArray()))
      RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());

    SkipWhitespaceAndComments<parseFlags>(is);
    RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

    if (Consume(is, ']'))
    { if (RAPIDJSON_UNLIKELY(!handler.EndArray(0))) // empty array
        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
      return;
    }

    for (SizeType elementCount = 0;;)
    { ParseValue<parseFlags>(is, handler);
      RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

      ++elementCount;
      SkipWhitespaceAndComments<parseFlags>(is);
      RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

      if (Consume(is, ','))
      { SkipWhitespaceAndComments<parseFlags>(is);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
      }
      else if (Consume(is, ']'))
      { if (RAPIDJSON_UNLIKELY(!handler.EndArray(elementCount)))
          RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
        return;
      }
      else
        RAPIDJSON_PARSE_ERROR(kParseErrorArrayMissCommaOrSquareBracket, is.Tell());

      if (parseFlags & kParseTrailingCommasFlag)
      { if (is.Peek() == ']')
        { if (RAPIDJSON_UNLIKELY(!handler.EndArray(elementCount)))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
          is.Take();
          return;
        }
      }
    }
  }